

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingcategory.cpp
# Opt level: O0

bool __thiscall QLoggingCategory::isEnabled(QLoggingCategory *this,QtMsgType msgtype)

{
  undefined4 in_ESI;
  bool local_1;
  
  switch(in_ESI) {
  case 0:
    local_1 = isDebugEnabled((QLoggingCategory *)0x2d2be8);
    break;
  case 1:
    local_1 = isWarningEnabled((QLoggingCategory *)0x2d2c0a);
    break;
  case 2:
    local_1 = isCriticalEnabled((QLoggingCategory *)0x2d2c1b);
    break;
  case 3:
    local_1 = true;
    break;
  case 4:
    local_1 = isInfoEnabled((QLoggingCategory *)0x2d2bf9);
    break;
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QLoggingCategory::isEnabled(QtMsgType msgtype) const
{
    switch (msgtype) {
    case QtDebugMsg: return isDebugEnabled();
    case QtInfoMsg: return isInfoEnabled();
    case QtWarningMsg: return isWarningEnabled();
    case QtCriticalMsg: return isCriticalEnabled();
    case QtFatalMsg: return true;
    }
    return false;
}